

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::AddCXXCompileCommand
          (cmGlobalNinjaGenerator *this,string *commandLine,string *sourceFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  cmGeneratedFileStream *pcVar5;
  ostream *poVar6;
  string sourceFileName;
  string buildFileDir;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar4 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
  std::__cxx11::string::string((string *)&local_88,pcVar4,(allocator *)&local_c8);
  pcVar5 = this->CompileCommandsStream;
  paVar1 = &local_c8.field_2;
  if (pcVar5 == (cmGeneratedFileStream *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    std::__cxx11::string::append((char *)&local_c8);
    pcVar5 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar5,local_c8._M_dataplus._M_p,false);
    this->CompileCommandsStream = pcVar5;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar5,"[",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar5,",",1);
    std::ios::widen((char)(pcVar5->super_ofstream).
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
                    + (char)pcVar5);
    std::ostream::put((char)pcVar5);
    std::ostream::flush();
  }
  pcVar2 = (sourceFile->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + sourceFile->_M_string_length);
  bVar3 = cmsys::SystemTools::FileIsFullPath(local_c8._M_dataplus._M_p);
  if (!bVar3) {
    pcVar4 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
    cmsys::SystemTools::CollapseFullPath(&local_a8,&local_c8,pcVar4);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar5 = this->CompileCommandsStream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar5,"\n{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar5,"  \"directory\": \"",0x10);
  cmGlobalGenerator::EscapeJSON(&local_a8,&local_88);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar5,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  \"command\": \"",0xe);
  cmGlobalGenerator::EscapeJSON(&local_48,commandLine);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\",\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  \"file\": \"",0xb);
  cmGlobalGenerator::EscapeJSON(&local_68,&local_c8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCXXCompileCommand(
                                      const std::string &commandLine,
                                      const std::string &sourceFile)
{
  // Compute Ninja's build file path.
  std::string buildFileDir =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  if (!this->CompileCommandsStream)
    {
    std::string buildFilePath = buildFileDir + "/compile_commands.json";

    // Get a stream where to generate things.
    this->CompileCommandsStream =
      new cmGeneratedFileStream(buildFilePath.c_str());
    *this->CompileCommandsStream << "[";
    } else {
    *this->CompileCommandsStream << "," << std::endl;
    }

  std::string sourceFileName = sourceFile;
  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str()))
    {
    sourceFileName = cmSystemTools::CollapseFullPath(
      sourceFileName,
      this->GetCMakeInstance()->GetHomeOutputDirectory());
    }


  *this->CompileCommandsStream << "\n{\n"
     << "  \"directory\": \""
     << cmGlobalGenerator::EscapeJSON(buildFileDir) << "\",\n"
     << "  \"command\": \""
     << cmGlobalGenerator::EscapeJSON(commandLine) << "\",\n"
     << "  \"file\": \""
     << cmGlobalGenerator::EscapeJSON(sourceFileName) << "\"\n"
     << "}";
}